

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void memRev(void *buf,size_t count)

{
  size_t sVar1;
  long lVar2;
  size_t i;
  size_t count_local;
  void *buf_local;
  
  i = count >> 1;
  while (sVar1 = i - 1, i != 0) {
    *(byte *)((long)buf + sVar1) =
         *(byte *)((long)buf + sVar1) ^ *(byte *)((long)buf + ((count - 1) - sVar1));
    lVar2 = (count - 1) - sVar1;
    *(byte *)((long)buf + lVar2) = *(byte *)((long)buf + lVar2) ^ *(byte *)((long)buf + sVar1);
    *(byte *)((long)buf + sVar1) =
         *(byte *)((long)buf + sVar1) ^ *(byte *)((long)buf + ((count - 1) - sVar1));
    i = sVar1;
  }
  return;
}

Assistant:

void memRev(void* buf, size_t count)
{
	register size_t i = count / 2;
	ASSERT(memIsValid(buf, count));
	while (i--)
	{
		((octet*)buf)[i] ^= ((octet*)buf)[count - 1 - i];
		((octet*)buf)[count - 1 - i] ^= ((octet*)buf)[i];
		((octet*)buf)[i] ^= ((octet*)buf)[count - 1 - i];
	}
}